

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  pointer piVar1;
  sps_t *psVar2;
  uint32_t r;
  uint uVar3;
  int **ppiVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  h264_stream_t *h_00;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int **ppiVar19;
  bool bVar20;
  
  pbVar7 = b->p;
  pbVar8 = b->end;
  uVar10 = b->bits_left;
  uVar3 = 0xffffffff;
  iVar11 = 0;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar7 < pbVar8) {
      bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
  iVar9 = 0;
  uVar3 = 0;
  if (iVar11 != -1) {
    iVar5 = -2 - iVar11;
    iVar14 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar17 = 0;
      if (pbVar7 < pbVar8) {
        uVar17 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar3 = uVar3 | uVar17 << ((byte)iVar5 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar14 != -2);
  }
  uVar17 = 0xffffffff;
  iVar11 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar3;
  __s = h->pps_table[iVar11];
  h->pps = __s;
  memset(__s,0,0x168);
  __s->pic_parameter_set_id = iVar11;
  pbVar7 = b->p;
  pbVar8 = b->end;
  uVar10 = b->bits_left;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar7 < pbVar8) {
      bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar17 = uVar17 + 1;
    iVar9 = iVar9 + -1;
  } while (((bool)(bVar20 & uVar17 < 0x20)) && (pbVar7 < pbVar8));
  uVar3 = 0;
  if (iVar9 == -1) {
    uVar17 = 0;
  }
  else {
    iVar11 = -2 - iVar9;
    iVar5 = -3 - iVar9;
    uVar17 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar12 = 0;
      if (pbVar7 < pbVar8) {
        uVar12 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar17 = uVar17 | uVar12 << ((byte)iVar11 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar5 != -2);
  }
  __s->seq_parameter_set_id = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar17;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  if (pbVar7 < pbVar8) {
    uVar3 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar10 = 8;
  }
  __s->entropy_coding_mode_flag = uVar3;
  h->info->encoding_type = uVar3;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  uVar3 = 0;
  if (pbVar7 < pbVar8) {
    uVar3 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar7 = pbVar7 + 1;
    b->p = pbVar7;
    uVar10 = 8;
  }
  __s->bottom_field_pic_order_in_frame_present_flag = uVar3;
  uVar3 = 0xffffffff;
  iVar11 = 0;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar7 < pbVar8) {
      bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar7 = pbVar7 + 1;
      b->p = pbVar7;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
  if (iVar11 == -1) {
    uVar3 = 0;
  }
  else {
    iVar9 = -2 - iVar11;
    iVar5 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar17 = 0;
      if (pbVar7 < pbVar8) {
        uVar17 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar3 = uVar3 | uVar17 << ((byte)iVar9 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar9 = iVar9 + -1;
    } while (iVar5 != -2);
  }
  uVar17 = 0xffffffff;
  uVar12 = -1 << (~(byte)iVar11 & 0x1f);
  uVar15 = ~uVar12;
  uVar16 = uVar15 + uVar3;
  __s->num_slice_groups_minus1 = uVar16;
  if (uVar16 != 0 && SCARRY4(uVar15,uVar3) == (int)uVar16 < 0) {
    uVar15 = 0xffffffff;
    iVar11 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar20 = true;
      if (pbVar7 < pbVar8) {
        bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar15 = uVar15 + 1;
      iVar11 = iVar11 + -1;
    } while (((bool)(bVar20 & uVar15 < 0x20)) && (pbVar7 < pbVar8));
    if (iVar11 == -1) {
      uVar15 = 0;
    }
    else {
      iVar9 = -2 - iVar11;
      iVar5 = -3 - iVar11;
      uVar15 = 0;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        uVar18 = 0;
        if (pbVar7 < pbVar8) {
          uVar18 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar15 = uVar15 | uVar18 << ((byte)iVar9 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar9 = iVar9 + -1;
      } while (iVar5 != -2);
    }
    iVar11 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar15;
    __s->slice_group_map_type = iVar11;
    switch(iVar11) {
    case 0:
      uVar13 = 0;
      do {
        uVar10 = b->bits_left;
        uVar3 = 0xffffffff;
        iVar11 = -2;
        do {
          iVar9 = iVar11;
          uVar12 = uVar3;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar20 = true;
          if (pbVar7 < pbVar8) {
            bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar3 = uVar12 + 1;
        } while (((bool)(bVar20 & uVar3 < 0x20)) && (iVar11 = iVar9 + 1, pbVar7 < pbVar8));
        uVar15 = 0;
        if (uVar3 != 0) {
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar18 = 0;
            if (pbVar7 < pbVar8) {
              uVar18 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar15 = uVar15 | uVar18 << ((byte)uVar12 & 0x1f);
            uVar12 = uVar12 - 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != -2);
        }
        __s->run_length_minus1[uVar13] = ~(-1 << ((byte)uVar3 & 0x1f)) + uVar15;
        bVar20 = uVar13 < uVar16;
        uVar13 = uVar13 + 1;
      } while (bVar20);
      break;
    case 2:
      uVar13 = 0;
      do {
        uVar3 = b->bits_left;
        uVar10 = 0xffffffff;
        iVar11 = -2;
        do {
          iVar9 = iVar11;
          uVar12 = uVar10;
          uVar3 = uVar3 - 1;
          b->bits_left = uVar3;
          bVar20 = true;
          if (pbVar7 < pbVar8) {
            bVar20 = (*pbVar7 >> (uVar3 & 0x1f) & 1) == 0;
          }
          if (uVar3 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar3 = 8;
          }
          uVar10 = uVar12 + 1;
        } while (((bool)(bVar20 & uVar10 < 0x20)) && (iVar11 = iVar9 + 1, pbVar7 < pbVar8));
        uVar15 = 0;
        if (uVar10 != 0) {
          do {
            uVar3 = uVar3 - 1;
            b->bits_left = uVar3;
            uVar18 = 0;
            if (pbVar7 < pbVar8) {
              uVar18 = (uint)((*pbVar7 >> (uVar3 & 0x1f) & 1) != 0);
            }
            if (uVar3 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar3 = 8;
            }
            uVar15 = uVar15 | uVar18 << ((byte)uVar12 & 0x1f);
            uVar12 = uVar12 - 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != -2);
        }
        __s->top_left[uVar13] = ~(-1 << ((byte)uVar10 & 0x1f)) + uVar15;
        uVar10 = b->bits_left;
        uVar3 = 0xffffffff;
        iVar11 = -2;
        do {
          iVar9 = iVar11;
          uVar12 = uVar3;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar20 = true;
          if (pbVar7 < pbVar8) {
            bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar3 = uVar12 + 1;
        } while (((bool)(bVar20 & uVar3 < 0x20)) && (iVar11 = iVar9 + 1, pbVar7 < pbVar8));
        uVar15 = 0;
        if (uVar3 != 0) {
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar18 = 0;
            if (pbVar7 < pbVar8) {
              uVar18 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar7 = pbVar7 + 1;
              b->p = pbVar7;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar15 = uVar15 | uVar18 << ((byte)uVar12 & 0x1f);
            uVar12 = uVar12 - 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != -2);
        }
        __s->bottom_right[uVar13] = ~(-1 << ((byte)uVar3 & 0x1f)) + uVar15;
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar16);
      break;
    case 3:
    case 4:
    case 5:
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar3 = 0;
      if (pbVar7 < pbVar8) {
        uVar3 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar7 = pbVar7 + 1;
        b->p = pbVar7;
        uVar10 = 8;
      }
      __s->slice_group_change_direction_flag = uVar3;
      uVar3 = 0xffffffff;
      iVar11 = 0;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar20 = true;
        if (pbVar7 < pbVar8) {
          bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar3 = uVar3 + 1;
        iVar11 = iVar11 + -1;
      } while (((bool)(bVar20 & uVar3 < 0x20)) && (pbVar7 < pbVar8));
      if (iVar11 == -1) {
        uVar3 = 0;
      }
      else {
        iVar9 = -2 - iVar11;
        iVar5 = -3 - iVar11;
        uVar3 = 0;
        do {
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          uVar12 = 0;
          if (pbVar7 < pbVar8) {
            uVar12 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
          }
          if (uVar10 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar3 = uVar3 | uVar12 << ((byte)iVar9 & 0x1f);
          iVar5 = iVar5 + -1;
          iVar9 = iVar9 + -1;
        } while (iVar5 != -2);
      }
      __s->slice_group_change_rate_minus1 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar3;
      break;
    case 6:
      uVar15 = 0xffffffff;
      iVar11 = 0;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar20 = true;
        if (pbVar7 < pbVar8) {
          bVar20 = (*pbVar7 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar7 = pbVar7 + 1;
          b->p = pbVar7;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar15 = uVar15 + 1;
        iVar11 = iVar11 + -1;
      } while (((bool)(bVar20 & uVar15 < 0x20)) && (pbVar7 < pbVar8));
      uVar15 = 0;
      if (iVar11 != -1) {
        iVar9 = -2 - iVar11;
        iVar5 = -3 - iVar11;
        uVar15 = 0;
        do {
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          uVar16 = 0;
          if (pbVar7 < pbVar8) {
            uVar16 = (uint)((*pbVar7 >> (uVar10 & 0x1f) & 1) != 0);
          }
          if (uVar10 == 0) {
            pbVar7 = pbVar7 + 1;
            b->p = pbVar7;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar15 = uVar15 | uVar16 << ((byte)iVar9 & 0x1f);
          iVar5 = iVar5 + -1;
          iVar9 = iVar9 + -1;
        } while (iVar5 != -2);
      }
      uVar16 = -1 << (~(byte)iVar11 & 0x1f);
      __s->pic_size_in_map_units_minus1 = ~uVar16 + uVar15;
      uVar3 = uVar3 - uVar12;
      uVar10 = 0;
      iVar11 = -1;
      if (0 < (int)uVar3) {
        uVar10 = uVar3;
      }
      do {
        iVar9 = iVar11;
        iVar11 = iVar9 + 1;
      } while (uVar10 >> ((byte)iVar11 & 0x1f) != 0);
      if (uVar10 != 1 << ((byte)iVar9 & 0x1f)) {
        iVar9 = iVar11;
      }
      iVar5 = 0;
      if (iVar11 != 0) {
        iVar5 = iVar9;
      }
      __s->slice_group_id_bytes = iVar5;
      std::vector<int,_std::allocator<int>_>::resize
                (&__s->slice_group_id,(long)(int)(uVar15 - uVar16));
      if (-1 < __s->pic_size_in_map_units_minus1) {
        piVar1 = (__s->slice_group_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          iVar11 = __s->slice_group_id_bytes;
          uVar10 = 0;
          if (0 < iVar11) {
            pbVar7 = b->p;
            uVar3 = b->bits_left;
            uVar10 = 0;
            do {
              iVar11 = iVar11 + -1;
              uVar3 = uVar3 - 1;
              b->bits_left = uVar3;
              uVar12 = 0;
              if (pbVar7 < b->end) {
                uVar12 = (uint)((*pbVar7 >> (uVar3 & 0x1f) & 1) != 0);
              }
              if (uVar3 == 0) {
                pbVar7 = pbVar7 + 1;
                b->p = pbVar7;
                b->bits_left = 8;
                uVar3 = 8;
              }
              uVar10 = uVar10 | uVar12 << ((byte)iVar11 & 0x1f);
            } while (iVar11 != 0);
          }
          piVar1[lVar6] = uVar10;
          bVar20 = lVar6 < __s->pic_size_in_map_units_minus1;
          lVar6 = lVar6 + 1;
        } while (bVar20);
      }
    }
  }
  pbVar8 = b->p;
  pbVar7 = b->end;
  uVar10 = b->bits_left;
  iVar11 = 0;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar8 < pbVar7) {
      bVar20 = (*pbVar8 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar17 = uVar17 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar17 < 0x20)) && (pbVar8 < pbVar7));
  iVar9 = 0;
  if (iVar11 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar11;
    iVar14 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar17 = 0;
      if (pbVar8 < pbVar7) {
        uVar17 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar3 = uVar3 | uVar17 << ((byte)iVar5 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar14 != -2);
  }
  uVar17 = 0xffffffff;
  __s->num_ref_idx_l0_active_minus1 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar3;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar8 < pbVar7) {
      bVar20 = (*pbVar8 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar17 = uVar17 + 1;
    iVar9 = iVar9 + -1;
  } while (((bool)(bVar20 & uVar17 < 0x20)) && (pbVar8 < pbVar7));
  uVar3 = 0;
  if (iVar9 == -1) {
    uVar17 = 0;
  }
  else {
    iVar11 = -2 - iVar9;
    iVar5 = -3 - iVar9;
    uVar17 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar12 = 0;
      if (pbVar8 < pbVar7) {
        uVar12 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar17 = uVar17 | uVar12 << ((byte)iVar11 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar5 != -2);
  }
  __s->num_ref_idx_l1_active_minus1 = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar17;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  if (pbVar8 < pbVar7) {
    uVar3 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar8 = pbVar8 + 1;
    b->p = pbVar8;
    uVar10 = 8;
  }
  __s->weighted_pred_flag = uVar3;
  uVar3 = 0;
  iVar11 = 1;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar17 = 0;
    if (pbVar8 < pbVar7) {
      uVar17 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar3 = uVar3 | uVar17 << ((byte)iVar11 & 0x1f);
    bVar20 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar20);
  __s->weighted_bipred_idc = uVar3;
  uVar3 = 0xffffffff;
  iVar11 = 0;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar8 < pbVar7) {
      bVar20 = (*pbVar8 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar3 < 0x20)) && (pbVar8 < pbVar7));
  iVar9 = 0;
  if (iVar11 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar11;
    iVar14 = -3 - iVar11;
    uVar3 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar17 = 0;
      if (pbVar8 < pbVar7) {
        uVar17 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar3 = uVar3 | uVar17 << ((byte)iVar5 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar14 != -2);
  }
  uVar12 = 0xffffffff;
  uVar15 = -1 << (~(byte)iVar11 & 0x1f);
  uVar17 = ~uVar15 + uVar3;
  iVar11 = -((int)uVar17 >> 1);
  if ((uVar17 & 1) != 0) {
    iVar11 = (int)(uVar3 - uVar15) >> 1;
  }
  __s->pic_init_qp_minus26 = iVar11;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar8 < pbVar7) {
      bVar20 = (*pbVar8 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar12 = uVar12 + 1;
    iVar9 = iVar9 + -1;
  } while (((bool)(bVar20 & uVar12 < 0x20)) && (pbVar8 < pbVar7));
  iVar11 = 0;
  if (iVar9 == -1) {
    uVar3 = 0;
  }
  else {
    iVar5 = -2 - iVar9;
    iVar14 = -3 - iVar9;
    uVar3 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar17 = 0;
      if (pbVar8 < pbVar7) {
        uVar17 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar3 = uVar3 | uVar17 << ((byte)iVar5 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar14 != -2);
  }
  uVar12 = 0xffffffff;
  uVar15 = -1 << (~(byte)iVar9 & 0x1f);
  uVar17 = ~uVar15 + uVar3;
  iVar9 = -((int)uVar17 >> 1);
  if ((uVar17 & 1) != 0) {
    iVar9 = (int)(uVar3 - uVar15) >> 1;
  }
  __s->pic_init_qs_minus26 = iVar9;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar20 = true;
    if (pbVar8 < pbVar7) {
      bVar20 = (*pbVar8 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar12 = uVar12 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar20 & uVar12 < 0x20)) && (pbVar8 < pbVar7));
  uVar3 = 0;
  if (iVar11 == -1) {
    uVar17 = 0;
  }
  else {
    iVar9 = -2 - iVar11;
    iVar5 = -3 - iVar11;
    uVar17 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar12 = 0;
      if (pbVar8 < pbVar7) {
        uVar12 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar17 = uVar17 | uVar12 << ((byte)iVar9 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar9 = iVar9 + -1;
    } while (iVar5 != -2);
  }
  uVar15 = -1 << (~(byte)iVar11 & 0x1f);
  uVar12 = ~uVar15 + uVar17;
  iVar11 = -((int)uVar12 >> 1);
  if ((uVar12 & 1) != 0) {
    iVar11 = (int)(uVar17 - uVar15) >> 1;
  }
  __s->chroma_qp_index_offset = iVar11;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  if (pbVar8 < pbVar7) {
    uVar3 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar8 = pbVar8 + 1;
    b->p = pbVar8;
    uVar10 = 8;
  }
  __s->deblocking_filter_control_present_flag = uVar3;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  uVar3 = 0;
  if (pbVar8 < pbVar7) {
    uVar3 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar8 = pbVar8 + 1;
    b->p = pbVar8;
    uVar10 = 8;
  }
  __s->constrained_intra_pred_flag = uVar3;
  uVar10 = uVar10 - 1;
  h_00 = (h264_stream_t *)(ulong)uVar10;
  b->bits_left = uVar10;
  uVar3 = 0;
  if (pbVar8 < pbVar7) {
    uVar3 = (uint)((*pbVar8 >> (uVar10 & 0x1f) & 1) != 0);
  }
  if (uVar10 == 0) {
    pbVar8 = pbVar8 + 1;
    b->p = pbVar8;
    b->bits_left = 8;
    h_00 = (h264_stream_t *)0x8;
  }
  __s->redundant_pic_cnt_present_flag = uVar3;
  psVar2 = h->sps;
  uVar10 = psVar2->profile_idc - 0x42;
  if (((uVar10 < 0x17) && ((0x400801U >> (uVar10 & 0x1f) & 1) != 0)) &&
     (((psVar2->constraint_set2_flag << 2 |
       psVar2->constraint_set1_flag * 2 | psVar2->constraint_set0_flag) & 7U) != 0)) {
    iVar11 = 0;
    lVar6 = 0xd0;
  }
  else {
    __s->_more_rbsp_data_present = 1;
    uVar3 = (int)h_00 - 1;
    b->bits_left = uVar3;
    uVar10 = 0;
    if (pbVar8 < pbVar7) {
      uVar10 = (uint)((*pbVar8 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      uVar3 = 8;
    }
    __s->transform_8x8_mode_flag = uVar10;
    uVar3 = uVar3 - 1;
    h_00 = (h264_stream_t *)(ulong)uVar3;
    b->bits_left = uVar3;
    uVar10 = 0;
    if (pbVar8 < pbVar7) {
      uVar10 = (uint)((*pbVar8 >> (uVar3 & 0x1f) & 1) != 0);
    }
    if (uVar3 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      h_00 = (h264_stream_t *)0x8;
    }
    __s->pic_scaling_matrix_present_flag = uVar10;
    if (uVar10 != 0) {
      ppiVar19 = __s->ScalingList4x4;
      uVar13 = 0;
      do {
        uVar3 = b->bits_left - 1;
        b->bits_left = uVar3;
        pbVar7 = b->p;
        uVar10 = 0;
        if (pbVar7 < b->end) {
          uVar10 = (uint)((*pbVar7 >> (uVar3 & 0x1f) & 1) != 0);
        }
        if (uVar3 == 0) {
          b->p = pbVar7 + 1;
          b->bits_left = 8;
        }
        __s->pic_scaling_list_present_flag[uVar13] = uVar10;
        if (uVar10 != 0) {
          ppiVar4 = ppiVar19 + 3;
          if (uVar13 < 6) {
            ppiVar4 = ppiVar19;
          }
          iVar11 = 0x40;
          if (uVar13 < 6) {
            iVar11 = 0x10;
          }
          read_scaling_list(b,*ppiVar4,iVar11,uVar10);
        }
        ppiVar19 = ppiVar19 + 1;
        bVar20 = (long)uVar13 < (long)__s->transform_8x8_mode_flag * 2 + 5;
        uVar13 = uVar13 + 1;
      } while (bVar20);
      pbVar8 = b->p;
      pbVar7 = b->end;
      h_00 = (h264_stream_t *)(ulong)(uint)b->bits_left;
    }
    uVar10 = 0xffffffff;
    iVar11 = 0;
    do {
      uVar3 = (int)h_00 - 1;
      h_00 = (h264_stream_t *)(ulong)uVar3;
      b->bits_left = uVar3;
      bVar20 = true;
      if (pbVar8 < pbVar7) {
        bVar20 = (*pbVar8 >> (uVar3 & 0x1f) & 1) == 0;
      }
      if (uVar3 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        h_00 = (h264_stream_t *)0x8;
      }
      uVar10 = uVar10 + 1;
      iVar11 = iVar11 + -1;
    } while (((bool)(bVar20 & uVar10 < 0x20)) && (pbVar8 < pbVar7));
    if (iVar11 == -1) {
      uVar10 = 0;
    }
    else {
      iVar9 = -2 - iVar11;
      iVar5 = -3 - iVar11;
      uVar10 = 0;
      do {
        uVar3 = (int)h_00 - 1;
        h_00 = (h264_stream_t *)(ulong)uVar3;
        b->bits_left = uVar3;
        uVar17 = 0;
        if (pbVar8 < pbVar7) {
          uVar17 = (uint)((*pbVar8 >> (uVar3 & 0x1f) & 1) != 0);
        }
        if (uVar3 == 0) {
          pbVar8 = pbVar8 + 1;
          b->p = pbVar8;
          b->bits_left = 8;
          h_00 = (h264_stream_t *)0x8;
        }
        uVar10 = uVar10 | uVar17 << ((byte)iVar9 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar9 = iVar9 + -1;
      } while (iVar5 != -2);
    }
    uVar17 = -1 << (~(byte)iVar11 & 0x1f);
    uVar3 = ~uVar17 + uVar10;
    iVar11 = -((int)uVar3 >> 1);
    if ((uVar3 & 1) != 0) {
      iVar11 = (int)(uVar10 - uVar17) >> 1;
    }
    lVar6 = 0x160;
  }
  *(int *)((long)__s->run_length_minus1 + lVar6 + -0x1c) = iVar11;
  read_rbsp_trailing_bits(h_00,b);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    int pps_id = bs_read_ue(b);
    pps_t* pps = h->pps = h->pps_table[pps_id] ;

    memset(pps, 0, sizeof(pps_t));

    int i;
    int i_group;

    pps->pic_parameter_set_id = pps_id;
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);

    // add by Late Lee
    h->info->encoding_type = pps->entropy_coding_mode_flag;

    //2005年版本此处为pps->pic_order_present_flag，2013年版本为bottom_field_pic_order_in_frame_present_flag
    pps->bottom_field_pic_order_in_frame_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            pps->slice_group_id_bytes = intlog2( pps->num_slice_groups_minus1 + 1 );
            pps->slice_group_id.resize(pps->pic_size_in_map_units_minus1 + 1);
            for( i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                pps->slice_group_id[ i ] = bs_read_u(b,  pps->slice_group_id_bytes); // was u(v)
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b,2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    pps->_more_rbsp_data_present = more_rbsp_data_in_pps(h, b);
    if( pps->_more_rbsp_data_present )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                           pps->UseDefaultScalingMatrix4x4Flag[ i ] );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                           pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }
    read_rbsp_trailing_bits(h, b);
}